

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_document::document_element(xml_document *this)

{
  xml_node_struct *p;
  xml_node local_10;
  
  p = ((this->super_xml_node)._root)->first_child;
  do {
    if (p == (xml_node_struct *)0x0) {
LAB_0070645c:
      xml_node::xml_node(&local_10);
      return (xml_node)local_10._root;
    }
    if ((p->header & 0xf) == 2) {
      xml_node::xml_node(&local_10,p);
      if (p != (xml_node_struct *)0x0) {
        return (xml_node)local_10._root;
      }
      goto LAB_0070645c;
    }
    p = p->next_sibling;
  } while( true );
}

Assistant:

PUGI_IMPL_FN xml_node xml_document::document_element() const
	{
		assert(_root);

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (PUGI_IMPL_NODETYPE(i) == node_element)
				return xml_node(i);

		return xml_node();
	}